

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O3

bool __thiscall OpenMD::BaseAtomVisitor::isVisited(BaseAtomVisitor *this,Atom *atom)

{
  undefined1 auVar1 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"VISITED","");
  StuntDouble::getPropertyByName((StuntDouble *)local_48,(string *)atom);
  this_00 = uStack_40;
  auVar1 = local_48;
  local_48 = (undefined1  [8])0x0;
  uStack_40._0_4_ = otAtom;
  uStack_40._4_4_ = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return auVar1 != (undefined1  [8])0x0;
}

Assistant:

bool BaseAtomVisitor::isVisited(Atom* atom) {
    std::shared_ptr<GenericData> data;
    data = atom->getPropertyByName("VISITED");
    return data == nullptr ? false : true;
  }